

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clunk.cpp
# Opt level: O1

void __thiscall clunk::Node::Undo<true>(Node *this,Move *move)

{
  byte *pbVar1;
  char *pcVar2;
  bool bVar3;
  long lVar4;
  undefined *puVar5;
  long lVar6;
  undefined *puVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  byte bVar12;
  uint to;
  int iVar13;
  uint pc;
  uint pc_00;
  uint type;
  ulong uVar14;
  ulong uVar15;
  
  if ((this->state & 1) == 0) {
    __assert_fail("COLOR(state) == color",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xae7,"void clunk::Node::Undo(const Move &) const [color = true]");
  }
  bVar3 = Move::IsValid(move);
  puVar5 = _EMPTY;
  if (!bVar3) {
    __assert_fail("move.IsValid()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xae8,"void clunk::Node::Undo(const Move &) const [color = true]");
  }
  uVar8 = move->bits;
  if ((uVar8 & 0x88000) != 0) {
    __assert_fail("IS_SQUARE(move.From())",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xae9,"void clunk::Node::Undo(const Move &) const [color = true]");
  }
  if ((uVar8 & 0x880) != 0) {
    __assert_fail("IS_SQUARE(move.To())",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xaea,"void clunk::Node::Undo(const Move &) const [color = true]");
  }
  if ((undefined *)(&_board)[uVar8 >> 0xc & 0xff] != _EMPTY) {
    __assert_fail("_board[move.From()] == _EMPTY",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xaeb,"void clunk::Node::Undo(const Move &) const [color = true]");
  }
  uVar10 = uVar8 >> 0x14 & 0xf;
  if (uVar10 != 0) {
    if ((uVar10 == 1) || (0xb < uVar10)) {
      __assert_fail("!move.Cap() || IS_CAP(move.Cap())",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0xaec,"void clunk::Node::Undo(const Move &) const [color = true]");
    }
    if ((uVar8 >> 0x14 & 1) != 0) {
      __assert_fail("!move.Cap() || (COLOR(move.Cap()) != color)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0xaed,"void clunk::Node::Undo(const Move &) const [color = true]");
    }
  }
  uVar10 = uVar8 >> 0x18 & 0xf;
  if (uVar10 != 0) {
    if (7 < uVar10 - 4) {
      __assert_fail("!move.Promo() || IS_PROMO(move.Promo())",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0xaee,"void clunk::Node::Undo(const Move &) const [color = true]");
    }
    if ((uVar8 >> 0x18 & 1) == 0) {
      __assert_fail("!move.Promo() || (COLOR(move.Promo()) == color)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0xaef,"void clunk::Node::Undo(const Move &) const [color = true]");
    }
  }
  _seenIndex = (-(uint)(_seenIndex != 0) | 99) + _seenIndex;
  if (99 < _seenIndex) {
    __assert_fail("(_seenIndex >= 0) & (_seenIndex < MaxPlies)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xaf2,"void clunk::Node::Undo(const Move &) const [color = true]");
  }
  uVar8 = (uint)this->positionKey & 0x3fff;
  if (_seenFilter[uVar8] == '\0') {
    __assert_fail("_seenFilter[positionKey & SeenFilterMask]",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xaf3,"void clunk::Node::Undo(const Move &) const [color = true]");
  }
  _seenFilter[uVar8] = _seenFilter[uVar8] + -1;
  if (_seenStackTop < (undefined *)((long)&_seenStack + 1U)) {
    __assert_fail("_seenStackTop > _seenStack",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xaf7,"void clunk::Node::Undo(const Move &) const [color = true]");
  }
  _seenStackTop = _seenStackTop + -8;
  uVar8 = move->bits;
  uVar10 = uVar8 >> 4 & 0xff;
  uVar11 = (ulong)uVar10;
  pbVar1 = (byte *)(&_board)[uVar11];
  if ((pbVar1 == (byte *)0x0) || (pbVar1 == puVar5)) {
    __assert_fail("moved && (moved != _EMPTY)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xb01,"void clunk::Node::Undo(const Move &) const [color = true]");
  }
  bVar12 = *pbVar1;
  if (bVar12 == 0) {
    __assert_fail("moved->type",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xb02,"void clunk::Node::Undo(const Move &) const [color = true]");
  }
  if ((bVar12 & 1) == 0) {
    __assert_fail("COLOR(moved->type) == color",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xb03,"void clunk::Node::Undo(const Move &) const [color = true]");
  }
  if (pbVar1[1] != (byte)(uVar8 >> 4)) {
    __assert_fail("moved->sqr == to",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xb04,"void clunk::Node::Undo(const Move &) const [color = true]");
  }
  to = uVar8 >> 0xc & 0xff;
  uVar14 = (ulong)to;
  type = uVar8 >> 0x14 & 0xf;
  uVar15 = (ulong)type;
  pc_00 = uVar8 >> 0x18 & 0xf;
  uVar9 = uVar8 & 0xf;
  pc = (uint)bVar12;
  bVar12 = (byte)(uVar8 >> 0xc);
  if (uVar9 < 0xd) {
    if (uVar9 == 3) {
      if (pc_00 == 0) {
        if (type != 0) {
          (&_board)[uVar14] = pbVar1;
          pbVar1[1] = bVar12;
          AddPiece(type,uVar10);
          if (9 < type - 2) goto LAB_0012dfa3;
          _material = _material + *(int *)(_VALUE_OF + uVar15 * 4);
          lVar4 = *(long *)(_atk + uVar14 * 8);
          goto joined_r0x0012dc50;
        }
        if (pc != 3) {
          __assert_fail("moved->type == (color|Pawn)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                        ,0xb27,"void clunk::Node::Undo(const Move &) const [color = true]");
        }
        lVar4 = (long)this->ep;
        if ((lVar4 == 0x78) || (uVar10 != this->ep)) {
          __assert_fail("(ep != None) && (to == ep)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                        ,0xb28,"void clunk::Node::Undo(const Move &) const [color = true]");
        }
        if (*(undefined **)(&DAT_00169490 + lVar4 * 8) != puVar5) {
          __assert_fail("_board[sqr] == _EMPTY",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                        ,0xb2a,"void clunk::Node::Undo(const Move &) const [color = true]");
        }
        uVar14 = lVar4 + 0x10;
        iVar13 = (int)uVar14;
        if (*(long *)(_atk + lVar4 * 8 + 0x80) != 0) {
          TruncateAttacks(iVar13,-1);
        }
        puVar5 = _EMPTY;
        if ((uVar14 & 0xffffff88) != 0) goto LAB_0012e03e;
        lVar6 = (long)DAT_001698e8;
        if (7 < lVar6) {
          __assert_fail("_pcount[White|Pawn] < 8",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                        ,0x11e,"void clunk::AddPiece(const int, const int)");
        }
        DAT_001698e8 = DAT_001698e8 + 1;
        lVar6 = lVar6 * 2;
        puVar7 = &DAT_00169818 + lVar6;
        if (&DAT_00169827 < puVar7) {
          __assert_fail("pc < (_piece + BlackPawnOffset)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                        ,0x120,"void clunk::AddPiece(const int, const int)");
        }
        if (puVar7 == _EMPTY) goto LAB_0012e05d;
        *puVar7 = 2;
        (&DAT_00169819)[lVar6] = (char)uVar14;
        (&_board)[uVar14 & 0xffffffff] = puVar7;
        (&_board)[uVar11] = puVar5;
        *(byte **)((long)&_board + (ulong)(to * 8)) = pbVar1;
        pbVar1[1] = bVar12;
        _material = _material + 100;
        if (*(long *)(_atk + to * 8) != 0) {
          TruncateAttacks(to,uVar10);
        }
        if (*(long *)(_atk + uVar11 * 8) != 0) {
          ExtendAttacks(uVar10);
        }
        if (*(long *)(_atk + lVar4 * 8 + 0x80) != 0) {
          TruncateAttacks(iVar13,to);
        }
        UpdateKingDirs<false>(uVar10,iVar13);
        UpdateKingDirs<true>(uVar10,iVar13);
      }
      else {
        if (pc_00 != pc) {
          __assert_fail("moved->type == promo",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                        ,0xb09,"void clunk::Node::Undo(const Move &) const [color = true]");
        }
        if (type == 0) {
          __assert_fail("cap",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                        ,0xb0a,"void clunk::Node::Undo(const Move &) const [color = true]");
        }
        if (5 < pc_00) {
          ClearAttacksFrom(pc_00,uVar10);
        }
        RemovePiece(pc_00,uVar10);
        AddPiece(type,uVar10);
        if ((uVar8 & 0x88000) != 0) goto LAB_0012e03e;
        lVar4 = (long)DAT_001698ec;
        if (7 < lVar4) goto LAB_0012e07c;
        DAT_001698ec = DAT_001698ec + 1;
        lVar4 = lVar4 * 2;
        puVar5 = &DAT_00169828 + lVar4;
        if (&DAT_00169837 < puVar5) goto LAB_0012e09b;
        if (puVar5 == _EMPTY) goto LAB_0012e05d;
        *puVar5 = 3;
        (&DAT_00169829)[lVar4] = bVar12;
        (&_board)[uVar14] = puVar5;
        if ((9 < pc_00 - 2) ||
           (DAT_00169914 = (DAT_00169914 - *(int *)(_VALUE_OF + (ulong)pc_00 * 4)) + 100,
           9 < type - 2)) goto LAB_0012dfa3;
        _material = _material + *(int *)(_VALUE_OF + uVar15 * 4);
        lVar4 = *(long *)(_atk + uVar14 * 8);
joined_r0x0012dc50:
        if (lVar4 != 0) {
          TruncateAttacks(to,uVar10);
        }
        if (5 < type) {
          AddAttacksFrom(type,uVar10);
        }
      }
      UpdateKingDirs<false>(uVar10,to);
      goto LAB_0012de19;
    }
    if (uVar9 == 0xc) {
      ClearKingDirs<true>(uVar10);
      (&_board)[uVar14] = pbVar1;
      pbVar1[1] = bVar12;
      if (type == 0) {
        (&_board)[uVar11] = _EMPTY;
LAB_0012db95:
        if (*(long *)(_atk + uVar14 * 8) != 0) {
          TruncateAttacks(to,uVar10);
        }
        if (type < 6) {
          if ((type == 0) && (*(long *)(_atk + uVar11 * 8) != 0)) {
            ExtendAttacks(uVar10);
          }
        }
        else {
          AddAttacksFrom(type,uVar10);
        }
        SetKingDirs<true>(to);
        UpdateKingDirs<false>(uVar10,to);
        return;
      }
      AddPiece(type,uVar10);
      if (type - 2 < 10) {
        _material = _material + *(int *)(_VALUE_OF + uVar15 * 4);
        goto LAB_0012db95;
      }
      goto LAB_0012dfa3;
    }
  }
  else {
    if (uVar9 == 0xd) {
      if (pbVar1 != PTR_DAT_0015d338) {
        __assert_fail("moved == (color ? _KING[Black] : _KING[White])",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0xb5a,"void clunk::Node::Undo(const Move &) const [color = true]");
      }
      if (to != 0x74) {
        __assert_fail("from == (color ? E8 : E1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0xb5b,"void clunk::Node::Undo(const Move &) const [color = true]");
      }
      if (uVar10 != 0x76) {
        __assert_fail("to == (color ? G8 : G1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0xb5c,"void clunk::Node::Undo(const Move &) const [color = true]");
      }
      if (type != 0) {
        __assert_fail("!cap",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0xb5d,"void clunk::Node::Undo(const Move &) const [color = true]");
      }
      if (pc_00 != 0) {
        __assert_fail("!promo",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0xb5e,"void clunk::Node::Undo(const Move &) const [color = true]");
      }
      if (DAT_001697b0 != puVar5) {
        __assert_fail("_board[color ? E8 : E1] == _EMPTY",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0xb5f,"void clunk::Node::Undo(const Move &) const [color = true]");
      }
      if (DAT_001697c8 != puVar5) {
        __assert_fail("_board[color ? H8 : H1] == _EMPTY",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0xb60,"void clunk::Node::Undo(const Move &) const [color = true]");
      }
      if (DAT_001697b8 == puVar5) {
        __assert_fail("_board[color ? F8 : F1] != _EMPTY",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0xb61,"void clunk::Node::Undo(const Move &) const [color = true]");
      }
      if (DAT_001697c0 == puVar5) {
        __assert_fail("_board[color ? G8 : G1] != _EMPTY",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0xb62,"void clunk::Node::Undo(const Move &) const [color = true]");
      }
      if (*DAT_001697b8 != '\t') {
        __assert_fail("_board[color ? F8 : F1]->type == (color|Rook)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0xb63,"void clunk::Node::Undo(const Move &) const [color = true]");
      }
      ClearKingDirs<true>(0x76);
      ClearAttacksFrom(9,0x75);
      pcVar2 = DAT_001697b8;
      DAT_001697c0 = _EMPTY;
      DAT_001697c8 = DAT_001697b8;
      DAT_001697b8 = _EMPTY;
      DAT_001697b0 = pbVar1;
      pbVar1[1] = 0x74;
      pcVar2[1] = 'w';
      SetKingDirs<true>(0x74);
      if (_kingDir[0x7c] == -1) {
        if (_kingDir[0x7d] != -1) {
          __assert_fail("_kingDir[color ? (F8 + 8) : F1] == West",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                        ,0xb6e,"void clunk::Node::Undo(const Move &) const [color = true]");
        }
        _kingDir[0x7d] = '\0';
      }
      if (_atk._928_8_ != 0) {
        TruncateAttacks(0x74,0x76);
      }
      iVar13 = 0x77;
LAB_0012db1b:
      AddAttacksFrom(9,iVar13);
      return;
    }
    if (uVar9 == 0xe) {
      if (pbVar1 != PTR_DAT_0015d338) {
        __assert_fail("moved == (color ? _KING[Black] : _KING[White])",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0xb77,"void clunk::Node::Undo(const Move &) const [color = true]");
      }
      if (to != 0x74) {
        __assert_fail("from == (color ? E8 : E1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0xb78,"void clunk::Node::Undo(const Move &) const [color = true]");
      }
      if (uVar10 != 0x72) {
        __assert_fail("to == (color ? C8 : C1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0xb79,"void clunk::Node::Undo(const Move &) const [color = true]");
      }
      if (type != 0) {
        __assert_fail("!cap",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0xb7a,"void clunk::Node::Undo(const Move &) const [color = true]");
      }
      if (pc_00 != 0) {
        __assert_fail("!promo",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0xb7b,"void clunk::Node::Undo(const Move &) const [color = true]");
      }
      if (DAT_001697b0 != puVar5) {
        __assert_fail("_board[color ? E8 : E1] == _EMPTY",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0xb7c,"void clunk::Node::Undo(const Move &) const [color = true]");
      }
      if (DAT_00169790 != puVar5) {
        __assert_fail("_board[color ? A8 : A1] == _EMPTY",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0xb7d,"void clunk::Node::Undo(const Move &) const [color = true]");
      }
      if (DAT_00169798 != puVar5) {
        __assert_fail("_board[color ? B8 : B1] == _EMPTY",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0xb7e,"void clunk::Node::Undo(const Move &) const [color = true]");
      }
      if (DAT_001697a0 == puVar5) {
        __assert_fail("_board[color ? C8 : C1] != _EMPTY",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0xb7f,"void clunk::Node::Undo(const Move &) const [color = true]");
      }
      if (DAT_001697a8 == puVar5) {
        __assert_fail("_board[color ? D8 : D1] != _EMPTY",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0xb80,"void clunk::Node::Undo(const Move &) const [color = true]");
      }
      if (*DAT_001697a8 != '\t') {
        __assert_fail("_board[color ? D8 : D1]->type == (color|Rook)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0xb81,"void clunk::Node::Undo(const Move &) const [color = true]");
      }
      ClearKingDirs<true>(0x72);
      ClearAttacksFrom(9,0x73);
      pcVar2 = DAT_001697a8;
      DAT_00169790 = DAT_001697a8;
      DAT_001697a8 = _EMPTY;
      DAT_001697a0 = _EMPTY;
      DAT_001697b0 = pbVar1;
      pbVar1[1] = 0x74;
      pcVar2[1] = 'p';
      SetKingDirs<true>(0x74);
      if (_kingDir[0x7c] == '\x01') {
        if (_kingDir[0x7b] != '\x01') {
          __assert_fail("_kingDir[color ? (D8 + 8) : D1] == East",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                        ,0xb8c,"void clunk::Node::Undo(const Move &) const [color = true]");
        }
        _kingDir[0x7b] = '\0';
      }
      if (_atk._928_8_ != 0) {
        TruncateAttacks(0x74,0x72);
      }
      iVar13 = 0x70;
      goto LAB_0012db1b;
    }
  }
  if (_FIRST_SLIDER <= pbVar1) {
    ClearAttacksFrom(pc,uVar10);
  }
  if (pc_00 == 0) {
    (&_board)[uVar14] = pbVar1;
    pbVar1[1] = bVar12;
  }
  else {
    if ((move->bits & 0xf) != 1) {
      __assert_fail("move.Type() == PawnMove",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0xb99,"void clunk::Node::Undo(const Move &) const [color = true]");
    }
    if (pc_00 != *pbVar1) {
      __assert_fail("moved->type == promo",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0xb9a,"void clunk::Node::Undo(const Move &) const [color = true]");
    }
    RemovePiece(pc_00,uVar10);
    if ((uVar8 & 0x88000) != 0) {
LAB_0012e03e:
      __assert_fail("IS_SQUARE(sqr)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0x11a,"void clunk::AddPiece(const int, const int)");
    }
    lVar4 = (long)DAT_001698ec;
    if (7 < lVar4) {
LAB_0012e07c:
      __assert_fail("_pcount[Black|Pawn] < 8",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0x123,"void clunk::AddPiece(const int, const int)");
    }
    DAT_001698ec = DAT_001698ec + 1;
    lVar4 = lVar4 * 2;
    puVar5 = &DAT_00169828 + lVar4;
    if (&DAT_00169837 < puVar5) {
LAB_0012e09b:
      __assert_fail("pc < (_piece + KnightOffset)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0x125,"void clunk::AddPiece(const int, const int)");
    }
    if (puVar5 == _EMPTY) {
LAB_0012e05d:
      __assert_fail("pc && (pc != _EMPTY)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0x167,"void clunk::AddPiece(const int, const int)");
    }
    *puVar5 = 3;
    (&DAT_00169829)[lVar4] = bVar12;
    (&_board)[uVar14] = puVar5;
    if (9 < pc_00 - 2) goto LAB_0012dfa3;
    DAT_00169914 = (DAT_00169914 - *(int *)(_VALUE_OF + (ulong)pc_00 * 4)) + 100;
  }
  if (type == 0) {
    (&_board)[uVar11] = _EMPTY;
  }
  else {
    AddPiece(type,uVar10);
    if (9 < type - 2) {
LAB_0012dfa3:
      __assert_fail("!pc || IS_CAP(pc)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0x114,"int clunk::ValueOf(const int)");
    }
    _material = _material + *(int *)(_VALUE_OF + uVar15 * 4);
  }
  if (*(long *)(_atk + uVar14 * 8) != 0) {
    TruncateAttacks(to,uVar10);
  }
  if (type < 6) {
    if ((type == 0) && (*(long *)(_atk + uVar11 * 8) != 0)) {
      ExtendAttacks(uVar10);
    }
  }
  else {
    AddAttacksFrom(type,uVar10);
  }
  if (_FIRST_SLIDER <= (byte *)(&_board)[uVar14]) {
    AddAttacksFrom((uint)*(byte *)(&_board)[uVar14],to);
  }
  UpdateKingDirs<false>(uVar10,to);
LAB_0012de19:
  UpdateKingDirs<true>(uVar10,to);
  return;
}

Assistant:

void Undo(const Move& move) const {
    assert(COLOR(state) == color);
    assert(move.IsValid());
    assert(IS_SQUARE(move.From()));
    assert(IS_SQUARE(move.To()));
    assert(_board[move.From()] == _EMPTY);
    assert(!move.Cap() || IS_CAP(move.Cap()));
    assert(!move.Cap() || (COLOR(move.Cap()) != color));
    assert(!move.Promo() || IS_PROMO(move.Promo()));
    assert(!move.Promo() || (COLOR(move.Promo()) == color));

    _seenIndex += ((MaxPlies * !_seenIndex) - 1);
    assert((_seenIndex >= 0) & (_seenIndex < MaxPlies));
    assert(_seenFilter[positionKey & SeenFilterMask]);
    _seenFilter[positionKey & SeenFilterMask]--;

#ifndef NDEBUG
    assert(_seenStackTop > _seenStack);
    _seenStackTop--;
#endif

    const int from  = move.From();
    const int to    = move.To();
    const int cap   = move.Cap();
    const int promo = move.Promo();

    Piece* moved = _board[to];
    assert(moved && (moved != _EMPTY));
    assert(moved->type);
    assert(COLOR(moved->type) == color);
    assert(moved->sqr == to);

    switch (move.Type()) {
    case PawnCap:
      if (promo) {
        assert(moved->type == promo);
        assert(cap);
        if (promo >= Bishop) {
          ClearAttacksFrom(promo, to);
        }
        RemovePiece(promo, to);
        AddPiece(cap, to);
        AddPiece((color|Pawn), from);
        _material[color] += (PawnValue - ValueOf(promo));
        _material[!color] += ValueOf(cap);
        if (_atk[from]) {
          TruncateAttacks(from, to);
        }
        if (cap >= Bishop) {
          AddAttacksFrom(cap, to);
        }
      }
      else if (cap) {
        _board[from] = moved;
        moved->sqr = from;
        AddPiece(cap, to);
        _material[!color] += ValueOf(cap);
        if (_atk[from]) {
          TruncateAttacks(from, to);
        }
        if (cap >= Bishop) {
          AddAttacksFrom(cap, to);
        }
      }
      else {
        assert(moved->type == (color|Pawn));
        assert((ep != None) && (to == ep));
        const int sqr = (ep + (color ? North : South));
        assert(_board[sqr] == _EMPTY);
        if (_atk[sqr]) {
          TruncateAttacks(sqr, -1);
        }
        AddPiece(((!color)|Pawn), sqr);
        _board[to] = _EMPTY;
        _board[from] = moved;
        moved->sqr = from;
        _material[!color] += PawnValue;
        if (_atk[from]) {
          TruncateAttacks(from, to);
        }
        if (_atk[to]) {
          ExtendAttacks(to);
        }
        if (_atk[sqr]) {
          TruncateAttacks(sqr, from);
        }
        UpdateKingDirs<White>(to, sqr);
        UpdateKingDirs<Black>(to, sqr);
      }
      UpdateKingDirs<White>(to, from);
      UpdateKingDirs<Black>(to, from);
      break;
    case KingMove:
      ClearKingDirs<color>(to);
      _board[from] = moved;
      moved->sqr = from;
      if (cap) {
        AddPiece(cap, to);
        _material[!color] += ValueOf(cap);
      }
      else {
        _board[to] = _EMPTY;
      }
      if (_atk[from]) {
        TruncateAttacks(from, to);
      }
      if (cap >= Bishop) {
        AddAttacksFrom(cap, to);
      }
      else if (!cap && _atk[to]) {
        ExtendAttacks(to);
      }
      SetKingDirs<color>(from);
      UpdateKingDirs<!color>(to, from);
      break;
    case CastleShort:
      assert(moved == (color ? _KING[Black] : _KING[White]));
      assert(from == (color ? E8 : E1));
      assert(to == (color ? G8 : G1));
      assert(!cap);
      assert(!promo);
      assert(_board[color ? E8 : E1] == _EMPTY);
      assert(_board[color ? H8 : H1] == _EMPTY);
      assert(_board[color ? F8 : F1] != _EMPTY);
      assert(_board[color ? G8 : G1] != _EMPTY);
      assert(_board[color ? F8 : F1]->type == (color|Rook));
      ClearKingDirs<color>(to);
      ClearAttacksFrom((color|Rook), (color ? F8 : F1));
      _board[color ? E8 : E1] = moved;
      _board[color ? G8 : G1] = _EMPTY;
      _board[color ? H8 : H1] = _board[color ? F8 : F1];
      _board[color ? F8 : F1] = _EMPTY;
      moved->sqr = from;
      _board[color ? H8 : H1]->sqr = (color ? H8 : H1);
      SetKingDirs<color>(from);
      if (_kingDir[color ? (E8 + 8) : E1] == West) {
        assert(_kingDir[color ? (F8 + 8) : F1] == West);
        _kingDir[color ? (F8 + 8) : F1] = 0;
      }
      if (_atk[from]) {
        TruncateAttacks(from, to);
      }
      AddAttacksFrom((color|Rook), (color ? H8 : H1));
      break;
    case CastleLong:
      assert(moved == (color ? _KING[Black] : _KING[White]));
      assert(from == (color ? E8 : E1));
      assert(to == (color ? C8 : C1));
      assert(!cap);
      assert(!promo);
      assert(_board[color ? E8 : E1] == _EMPTY);
      assert(_board[color ? A8 : A1] == _EMPTY);
      assert(_board[color ? B8 : B1] == _EMPTY);
      assert(_board[color ? C8 : C1] != _EMPTY);
      assert(_board[color ? D8 : D1] != _EMPTY);
      assert(_board[color ? D8 : D1]->type == (color|Rook));
      ClearKingDirs<color>(to);
      ClearAttacksFrom((color|Rook), (color ? D8 : D1));
      _board[color ? A8 : A1] = _board[color ? D8 : D1];
      _board[color ? D8 : D1] = _EMPTY;
      _board[color ? E8 : E1] = moved;
      _board[color ? C8 : C1] = _EMPTY;
      moved->sqr = from;
      _board[color ? A8 : A1]->sqr = (color ? A8 : A1);
      SetKingDirs<color>(from);
      if (_kingDir[color ? (E8 + 8) : E1] == East) {
        assert(_kingDir[color ? (D8 + 8) : D1] == East);
        _kingDir[color ? (D8 + 8) : D1] = 0;
      }
      if (_atk[from]) {
        TruncateAttacks(from, to);
      }
      AddAttacksFrom((color|Rook), (color ? A8 : A1));
      break;
    default:
      if (moved >= _FIRST_SLIDER) {
        ClearAttacksFrom(moved->type, to);
      }
      if (promo) {
        assert(move.Type() == PawnMove);
        assert(moved->type == promo);
        RemovePiece(promo, to);
        AddPiece((color|Pawn), from);
        _material[color] += (PawnValue - ValueOf(promo));
      }
      else {
        _board[from] = moved;
        moved->sqr = from;
      }
      if (cap) {
        AddPiece(cap, to);
        _material[!color] += ValueOf(cap);
      }
      else {
        _board[to] = _EMPTY;
      }
      if (_atk[from]) {
        TruncateAttacks(from, to);
      }
      if (cap >= Bishop) {
        AddAttacksFrom(cap, to);
      }
      else if (!cap && _atk[to]) {
        ExtendAttacks(to);
      }
      if (_board[from] >= _FIRST_SLIDER) {
        AddAttacksFrom(_board[from]->type, from);
      }
      UpdateKingDirs<White>(to, from);
      UpdateKingDirs<Black>(to, from);
    }

#if 0
    assert(VerifyAttacks(true));
#endif
  }